

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

int Ga2_ObjFindOrAddLit(Ga2_Man_t *p,Gia_Obj_t *pObj,int f)

{
  int iVar1;
  
  iVar1 = Ga2_ObjFindLit(p,pObj,f);
  if (iVar1 == -1) {
    iVar1 = p->nSatVars;
    p->nSatVars = iVar1 + 1;
    iVar1 = iVar1 * 2;
    Ga2_ObjAddLit(p,pObj,f,iVar1);
  }
  return iVar1;
}

Assistant:

static inline int Ga2_ObjFindOrAddLit( Ga2_Man_t * p, Gia_Obj_t * pObj, int f )  
{ 
    int Lit = Ga2_ObjFindLit( p, pObj, f );
    if ( Lit == -1 )
    {
        Lit = toLitCond( p->nSatVars++, 0 );
        Ga2_ObjAddLit( p, pObj, f, Lit );
    }
//    assert( Lit > 1 );
    return Lit;
}